

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QList<QStringView> * __thiscall
QStringView::split(QStringView *this,QRegularExpression *re,SplitBehavior behavior)

{
  long lVar1;
  QList<QStringView> *in_RDI;
  long in_FS_OFFSET;
  offset_in_QRegularExpression_to_subr in_stack_00000048;
  QRegularExpression *in_stack_00000058;
  QStringView *in_stack_00000060;
  SplitBehavior in_stack_000000fc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (anonymous_namespace)::
  splitString<QList<QStringView>,QStringView,QRegularExpressionMatchIterator(QRegularExpression::*)(QStringView,long_long,QRegularExpression::MatchType,QFlags<QRegularExpression::MatchOption>)const>
            (in_stack_00000060,in_stack_00000058,in_stack_00000048,in_stack_000000fc);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QList<QStringView> QStringView::split(const QRegularExpression &re, Qt::SplitBehavior behavior) const
{
    return splitString<QList<QStringView>>(*this, re, &QRegularExpression::globalMatchView, behavior);
}